

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O1

void __thiscall
Environment::putValue
          (Environment *this,Identifier *ident,Scope scope,ptr<Value> *value,bool constant)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Member *__tmp;
  element_type *peVar4;
  Symbol symbol;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  Scope local_54;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (ident->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + ident->_M_string_length);
  local_80 = (undefined1  [8])&PTR_evaluate_00130bb0;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_48 + (long)local_50);
  local_58 = constant;
  local_54 = scope;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  peVar4 = &((value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Member;
  if (peVar4 == (element_type *)0x0) {
    peVar4 = (element_type *)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var3 = (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  pmVar2 = std::__detail::
           _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,(key_type *)local_80);
  (pmVar2->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
  this_00 = (pmVar2->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (pmVar2->super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_80 = (undefined1  [8])&PTR_evaluate_00130bb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Environment::putValue(const Identifier &ident, Scope scope, ptr<Value> value, bool constant) {
    Symbol symbol(ident, constant, scope);
    symbols[symbol] = std::dynamic_pointer_cast<Member>(value);
}